

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap.h
# Opt level: O2

QPixmap * __thiscall QPixmap::operator=(QPixmap *this,QPixmap *other)

{
  undefined8 uVar1;
  long in_FS_OFFSET;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 0xaaaaaaaaaaaaaaaa;
  local_38 = 0xaaaaaaaaaaaaaaaa;
  uStack_30 = 0xaaaaaaaaaaaaaaaa;
  QPixmap((QPixmap *)&local_38,other);
  uVar1 = *(undefined8 *)(this + 0x10);
  *(undefined8 *)(this + 0x10) = local_28;
  local_28 = uVar1;
  ::QPixmap::~QPixmap((QPixmap *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

inline void swap(QPixmap &other) noexcept
    { data.swap(other.data); }